

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_INT RVar2;
  REF_CELL *ppRVar3;
  int cell;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long local_38;
  
  ppRVar3 = ref_subdiv->grid->cell + 8;
  local_38 = 8;
  do {
    ref_cell = *ppRVar3;
    if (0 < ref_cell->max) {
      uVar4 = 0;
      do {
        cell = (int)uVar4;
        if (ref_cell->c2n[(long)ref_cell->size_per * (long)cell] != -1) {
          uVar1 = ref_subdiv_map(ref_subdiv,ref_cell,cell);
          printf(" group %d cell %d map %d\n",local_38,uVar4,(ulong)uVar1);
          if (0 < ref_cell->edge_per) {
            lVar6 = 0;
            do {
              RVar2 = ref_subdiv_c2e(ref_subdiv,ref_cell,(REF_INT)lVar6,cell);
              lVar5 = (long)ref_cell->size_per * (long)cell;
              printf("  edge %d nodes %d %d mark %d\n",(long)RVar2,
                     (ulong)(uint)ref_cell->c2n[ref_cell->e2n[lVar6 * 2] + lVar5],
                     (ulong)(uint)ref_cell->c2n
                                  [(long)(int)lVar5 + (long)ref_cell->e2n[lVar6 * 2 + 1]],
                     (ulong)(uint)ref_subdiv->mark[RVar2]);
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->edge_per);
          }
        }
        uVar4 = (ulong)(cell + 1U);
      } while ((int)(cell + 1U) < ref_cell->max);
    }
    ppRVar3 = ref_subdiv->grid->cell + local_38 + 1;
    local_38 = local_38 + 1;
  } while (local_38 != 0x10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, cell_edge, edge, map;
  REF_CELL ref_cell;

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
      printf(" group %d cell %d map %d\n", group, cell, map);
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        edge = ref_subdiv_c2e(ref_subdiv, ref_cell, cell_edge, cell);
        printf("  edge %d nodes %d %d mark %d\n", edge,
               ref_cell_e2n(ref_cell, 0, cell_edge, cell),
               ref_cell_e2n(ref_cell, 1, cell_edge, cell),
               ref_subdiv_mark(ref_subdiv, edge));
      }
    }
  }
  return REF_SUCCESS;
}